

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::GELU_x86_avx::forward_inplace(GELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  float fVar8;
  float fVar9;
  float fVar10;
  long lVar11;
  undefined1 (*pauVar12) [32];
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float in_register_0000125c;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar38;
  float fVar40;
  float fVar42;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar37;
  float fVar39;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar41;
  undefined1 auVar36 [32];
  
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_GELU_x86_avx[-3]) != 0) {
    iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar17 = 0;
    uVar16 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar16 = uVar17;
    }
    for (; uVar17 != uVar16; uVar17 = uVar17 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar12 = (undefined1 (*) [32])(sVar3 * uVar17 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar14 = 0; iVar14 + 7 < iVar13; iVar14 = iVar14 + 8) {
        fVar8 = *(float *)*pauVar12;
        fVar29 = *(float *)(*pauVar12 + 4);
        fVar38 = *(float *)(*pauVar12 + 8);
        fVar40 = *(float *)(*pauVar12 + 0xc);
        fVar42 = *(float *)(*pauVar12 + 0x10);
        fVar9 = *(float *)(*pauVar12 + 0x14);
        fVar10 = *(float *)(*pauVar12 + 0x18);
        auVar4._4_4_ = (fVar29 * fVar29 * fVar29 * 0.044715 + fVar29) * 0.7978845;
        auVar4._0_4_ = (fVar8 * fVar8 * fVar8 * 0.044715 + fVar8) * 0.7978845;
        auVar4._8_4_ = (fVar38 * fVar38 * fVar38 * 0.044715 + fVar38) * 0.7978845;
        auVar4._12_4_ = (fVar40 * fVar40 * fVar40 * 0.044715 + fVar40) * 0.7978845;
        auVar4._16_4_ = (fVar42 * fVar42 * fVar42 * 0.044715 + fVar42) * 0.7978845;
        auVar4._20_4_ = (fVar9 * fVar9 * fVar9 * 0.044715 + fVar9) * 0.7978845;
        auVar4._24_4_ = (fVar10 * fVar10 * fVar10 * 0.044715 + fVar10) * 0.7978845;
        auVar4._28_4_ = in_register_0000125c + *(float *)(*pauVar12 + 0x1c);
        auVar34._8_4_ = 0xc1100000;
        auVar34._0_8_ = 0xc1100000c1100000;
        auVar34._12_4_ = 0xc1100000;
        auVar34._16_4_ = 0xc1100000;
        auVar34._20_4_ = 0xc1100000;
        auVar34._24_4_ = 0xc1100000;
        auVar34._28_4_ = 0xc1100000;
        auVar4 = vmaxps_avx(auVar34,auVar4);
        auVar35._8_4_ = 0x41100000;
        auVar35._0_8_ = 0x4110000041100000;
        auVar35._12_4_ = 0x41100000;
        auVar35._16_4_ = 0x41100000;
        auVar35._20_4_ = 0x41100000;
        auVar35._24_4_ = 0x41100000;
        auVar35._28_4_ = 0x41100000;
        auVar4 = vminps_avx(auVar35,auVar4);
        fVar19 = auVar4._0_4_;
        fVar28 = fVar19 * fVar19;
        fVar22 = auVar4._4_4_;
        fVar37 = fVar22 * fVar22;
        fVar23 = auVar4._8_4_;
        fVar39 = fVar23 * fVar23;
        fVar24 = auVar4._12_4_;
        fVar41 = fVar24 * fVar24;
        fVar25 = auVar4._16_4_;
        fVar43 = fVar25 * fVar25;
        fVar26 = auVar4._20_4_;
        fVar44 = fVar26 * fVar26;
        fVar27 = auVar4._24_4_;
        fVar45 = fVar27 * fVar27;
        fVar19 = ((((((fVar28 * -2.7607684e-16 + 2.000188e-13) * fVar28 + -8.604672e-11) * fVar28 +
                    5.1222973e-08) * fVar28 + 1.48572235e-05) * fVar28 + 0.00063726195) * fVar28 +
                 0.0048935246) * fVar19;
        fVar22 = ((((((fVar37 * -2.7607684e-16 + 2.000188e-13) * fVar37 + -8.604672e-11) * fVar37 +
                    5.1222973e-08) * fVar37 + 1.48572235e-05) * fVar37 + 0.00063726195) * fVar37 +
                 0.0048935246) * fVar22;
        auVar5._4_4_ = fVar22;
        auVar5._0_4_ = fVar19;
        fVar23 = ((((((fVar39 * -2.7607684e-16 + 2.000188e-13) * fVar39 + -8.604672e-11) * fVar39 +
                    5.1222973e-08) * fVar39 + 1.48572235e-05) * fVar39 + 0.00063726195) * fVar39 +
                 0.0048935246) * fVar23;
        auVar5._8_4_ = fVar23;
        fVar24 = ((((((fVar41 * -2.7607684e-16 + 2.000188e-13) * fVar41 + -8.604672e-11) * fVar41 +
                    5.1222973e-08) * fVar41 + 1.48572235e-05) * fVar41 + 0.00063726195) * fVar41 +
                 0.0048935246) * fVar24;
        auVar5._12_4_ = fVar24;
        fVar25 = ((((((fVar43 * -2.7607684e-16 + 2.000188e-13) * fVar43 + -8.604672e-11) * fVar43 +
                    5.1222973e-08) * fVar43 + 1.48572235e-05) * fVar43 + 0.00063726195) * fVar43 +
                 0.0048935246) * fVar25;
        auVar5._16_4_ = fVar25;
        fVar26 = ((((((fVar44 * -2.7607684e-16 + 2.000188e-13) * fVar44 + -8.604672e-11) * fVar44 +
                    5.1222973e-08) * fVar44 + 1.48572235e-05) * fVar44 + 0.00063726195) * fVar44 +
                 0.0048935246) * fVar26;
        auVar5._20_4_ = fVar26;
        fVar27 = ((((((fVar45 * -2.7607684e-16 + 2.000188e-13) * fVar45 + -8.604672e-11) * fVar45 +
                    5.1222973e-08) * fVar45 + 1.48572235e-05) * fVar45 + 0.00063726195) * fVar45 +
                 0.0048935246) * fVar27;
        auVar5._24_4_ = fVar27;
        auVar5._28_4_ = auVar4._28_4_;
        auVar36._0_4_ =
             ((fVar28 * 1.1982584e-06 + 0.00011853471) * fVar28 + 0.0022684347) * fVar28 +
             0.0048935246;
        auVar36._4_4_ =
             ((fVar37 * 1.1982584e-06 + 0.00011853471) * fVar37 + 0.0022684347) * fVar37 +
             0.0048935246;
        auVar36._8_4_ =
             ((fVar39 * 1.1982584e-06 + 0.00011853471) * fVar39 + 0.0022684347) * fVar39 +
             0.0048935246;
        auVar36._12_4_ =
             ((fVar41 * 1.1982584e-06 + 0.00011853471) * fVar41 + 0.0022684347) * fVar41 +
             0.0048935246;
        auVar36._16_4_ =
             ((fVar43 * 1.1982584e-06 + 0.00011853471) * fVar43 + 0.0022684347) * fVar43 +
             0.0048935246;
        auVar36._20_4_ =
             ((fVar44 * 1.1982584e-06 + 0.00011853471) * fVar44 + 0.0022684347) * fVar44 +
             0.0048935246;
        auVar36._24_4_ =
             ((fVar45 * 1.1982584e-06 + 0.00011853471) * fVar45 + 0.0022684347) * fVar45 +
             0.0048935246;
        auVar36._28_4_ = 0x4110140b;
        auVar4 = vrcpps_avx(auVar36);
        fVar19 = fVar19 * auVar4._0_4_;
        fVar22 = fVar22 * auVar4._4_4_;
        fVar23 = fVar23 * auVar4._8_4_;
        fVar24 = fVar24 * auVar4._12_4_;
        fVar25 = fVar25 * auVar4._16_4_;
        fVar26 = fVar26 * auVar4._20_4_;
        fVar27 = fVar27 * auVar4._24_4_;
        auVar6._4_4_ = auVar36._4_4_ * fVar22;
        auVar6._0_4_ = auVar36._0_4_ * fVar19;
        auVar6._8_4_ = auVar36._8_4_ * fVar23;
        auVar6._12_4_ = auVar36._12_4_ * fVar24;
        auVar6._16_4_ = auVar36._16_4_ * fVar25;
        auVar6._20_4_ = auVar36._20_4_ * fVar26;
        auVar6._24_4_ = auVar36._24_4_ * fVar27;
        auVar6._28_4_ = 0x4110140b;
        auVar5 = vsubps_avx(auVar5,auVar6);
        in_register_0000125c = auVar5._28_4_ + 1.0048935;
        auVar7._4_4_ = fVar29 * 0.5 * (fVar22 + 1.0 + auVar4._4_4_ * auVar5._4_4_);
        auVar7._0_4_ = fVar8 * 0.5 * (fVar19 + 1.0 + auVar4._0_4_ * auVar5._0_4_);
        auVar7._8_4_ = fVar38 * 0.5 * (fVar23 + 1.0 + auVar4._8_4_ * auVar5._8_4_);
        auVar7._12_4_ = fVar40 * 0.5 * (fVar24 + 1.0 + auVar4._12_4_ * auVar5._12_4_);
        auVar7._16_4_ = fVar42 * 0.5 * (fVar25 + 1.0 + auVar4._16_4_ * auVar5._16_4_);
        auVar7._20_4_ = fVar9 * 0.5 * (fVar26 + 1.0 + auVar4._20_4_ * auVar5._20_4_);
        auVar7._24_4_ = fVar10 * 0.5 * (fVar27 + 1.0 + auVar4._24_4_ * auVar5._24_4_);
        auVar7._28_4_ = *(float *)(*pauVar12 + 0x1c);
        *pauVar12 = auVar7;
        pauVar12 = pauVar12 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar14 + 3 < iVar13; iVar14 = iVar14 + 4) {
        fVar25 = *(float *)*pauVar12;
        fVar26 = *(float *)(*pauVar12 + 4);
        fVar27 = *(float *)(*pauVar12 + 8);
        fVar8 = *(float *)(*pauVar12 + 0xc);
        auVar20._0_4_ = (fVar25 * fVar25 * fVar25 * 0.044715 + fVar25) * 0.7978845;
        auVar20._4_4_ = (fVar26 * fVar26 * fVar26 * 0.044715 + fVar26) * 0.7978845;
        auVar20._8_4_ = (fVar27 * fVar27 * fVar27 * 0.044715 + fVar27) * 0.7978845;
        auVar20._12_4_ = (fVar8 * fVar8 * fVar8 * 0.044715 + fVar8) * 0.7978845;
        auVar30._8_4_ = 0xc1100000;
        auVar30._0_8_ = 0xc1100000c1100000;
        auVar30._12_4_ = 0xc1100000;
        auVar20 = vmaxps_avx(auVar30,auVar20);
        auVar31._8_4_ = 0x41100000;
        auVar31._0_8_ = 0x4110000041100000;
        auVar31._12_4_ = 0x41100000;
        auVar20 = vminps_avx(auVar31,auVar20);
        fVar19 = auVar20._0_4_;
        fVar29 = fVar19 * fVar19;
        fVar22 = auVar20._4_4_;
        fVar38 = fVar22 * fVar22;
        fVar23 = auVar20._8_4_;
        fVar40 = fVar23 * fVar23;
        fVar24 = auVar20._12_4_;
        fVar42 = fVar24 * fVar24;
        auVar21._0_4_ =
             ((((((fVar29 * -2.7607684e-16 + 2.000188e-13) * fVar29 + -8.604672e-11) * fVar29 +
                5.1222973e-08) * fVar29 + 1.48572235e-05) * fVar29 + 0.00063726195) * fVar29 +
             0.0048935246) * fVar19;
        auVar21._4_4_ =
             ((((((fVar38 * -2.7607684e-16 + 2.000188e-13) * fVar38 + -8.604672e-11) * fVar38 +
                5.1222973e-08) * fVar38 + 1.48572235e-05) * fVar38 + 0.00063726195) * fVar38 +
             0.0048935246) * fVar22;
        auVar21._8_4_ =
             ((((((fVar40 * -2.7607684e-16 + 2.000188e-13) * fVar40 + -8.604672e-11) * fVar40 +
                5.1222973e-08) * fVar40 + 1.48572235e-05) * fVar40 + 0.00063726195) * fVar40 +
             0.0048935246) * fVar23;
        auVar21._12_4_ =
             ((((((fVar42 * -2.7607684e-16 + 2.000188e-13) * fVar42 + -8.604672e-11) * fVar42 +
                5.1222973e-08) * fVar42 + 1.48572235e-05) * fVar42 + 0.00063726195) * fVar42 +
             0.0048935246) * fVar24;
        auVar32._0_4_ =
             ((fVar29 * 1.1982584e-06 + 0.00011853471) * fVar29 + 0.0022684347) * fVar29 +
             0.0048935246;
        auVar32._4_4_ =
             ((fVar38 * 1.1982584e-06 + 0.00011853471) * fVar38 + 0.0022684347) * fVar38 +
             0.0048935246;
        auVar32._8_4_ =
             ((fVar40 * 1.1982584e-06 + 0.00011853471) * fVar40 + 0.0022684347) * fVar40 +
             0.0048935246;
        auVar32._12_4_ =
             ((fVar42 * 1.1982584e-06 + 0.00011853471) * fVar42 + 0.0022684347) * fVar42 +
             0.0048935246;
        auVar20 = vrcpps_avx(auVar32);
        fVar19 = auVar21._0_4_ * auVar20._0_4_;
        fVar22 = auVar21._4_4_ * auVar20._4_4_;
        fVar23 = auVar21._8_4_ * auVar20._8_4_;
        fVar24 = auVar21._12_4_ * auVar20._12_4_;
        auVar33._0_4_ = auVar32._0_4_ * fVar19;
        auVar33._4_4_ = auVar32._4_4_ * fVar22;
        auVar33._8_4_ = auVar32._8_4_ * fVar23;
        auVar33._12_4_ = auVar32._12_4_ * fVar24;
        auVar21 = vsubps_avx(auVar21,auVar33);
        in_register_0000125c = 0.0;
        auVar18._0_4_ = fVar25 * 0.5 * (fVar19 + 1.0 + auVar20._0_4_ * auVar21._0_4_);
        auVar18._4_4_ = fVar26 * 0.5 * (fVar22 + 1.0 + auVar20._4_4_ * auVar21._4_4_);
        auVar18._8_4_ = fVar27 * 0.5 * (fVar23 + 1.0 + auVar20._8_4_ * auVar21._8_4_);
        auVar18._12_4_ = fVar8 * 0.5 * (fVar24 + 1.0 + auVar20._12_4_ * auVar21._12_4_);
        *(undefined1 (*) [16])*pauVar12 = auVar18;
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar11 = sVar3 * sVar2 * uVar17;
      for (; (int)lVar15 < iVar13; lVar15 = lVar15 + 1) {
        fVar19 = *(float *)((long)pvVar1 + lVar15 * 4 + lVar11);
        in_register_0000125c = 0.0;
        fVar22 = tanhf((fVar19 * fVar19 * 0.044715 * fVar19 + fVar19) * 0.7978845);
        *(float *)((long)pvVar1 + lVar15 * 4 + lVar11) = (fVar22 + 1.0) * fVar19 * 0.5;
      }
    }
    return 0;
  }
  iVar13 = GELU::forward_inplace
                     ((GELU *)((long)&this->_vptr_GELU_x86_avx + (long)this->_vptr_GELU_x86_avx[-3])
                      ,bottom_top_blob,opt);
  return iVar13;
}

Assistant:

int GELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}